

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::MemberInitSeparator::operator()
          (MemberInitSeparator *this)

{
  Printer *pPVar1;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  MemberInitSeparator *local_10;
  MemberInitSeparator *this_local;
  
  local_10 = this;
  if ((this->separators_ & 1U) == 0) {
    pPVar1 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,": ");
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_38._M_len,local_38._M_str);
    io::Printer::Indent(this->printer_);
    this->separators_ = true;
  }
  else {
    pPVar1 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,",\n");
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_20._M_len,local_20._M_str);
  }
  return;
}

Assistant:

void operator()() {
    if (separators_) {
      printer_->Emit(",\n");
    } else {
      printer_->Emit(": ");
      printer_->Indent();
      separators_ = true;
    }
  }